

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  ulong __val;
  char cVar1;
  int iVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Response *pRVar9;
  _Rb_tree_header *p_Var10;
  char cVar11;
  char *pcVar12;
  Stream *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  Headers *pHVar14;
  bool bVar15;
  bool bVar16;
  string length;
  string chunk;
  string ret;
  key_type local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Stream *local_e8;
  Response *local_e0;
  Headers *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Request *local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  long local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Server *local_48;
  _Any_data *local_40;
  _Base_ptr local_38;
  
  iVar2 = res->status;
  if (iVar2 == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                  ,0x671,
                  "void httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < iVar2) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    iVar2 = res->status;
  }
  if (iVar2 < 400) {
    switch(iVar2) {
    case 0x12d:
      local_128._M_dataplus._M_p = "Moved Permanently";
      break;
    case 0x12e:
      local_128._M_dataplus._M_p = "Found";
      break;
    case 0x12f:
      local_128._M_dataplus._M_p = "See Other";
      break;
    case 0x130:
      local_128._M_dataplus._M_p = "Not Modified";
      break;
    default:
      if (iVar2 != 200) goto LAB_001455a9;
      local_128._M_dataplus._M_p = "OK";
    }
  }
  else if (iVar2 < 0x194) {
    if (iVar2 == 400) {
      local_128._M_dataplus._M_p = "Bad Request";
    }
    else if (iVar2 == 0x193) {
      local_128._M_dataplus._M_p = "Forbidden";
    }
    else {
LAB_001455a9:
      local_128._M_dataplus._M_p = "Internal Server Error";
    }
  }
  else if (iVar2 == 0x194) {
    local_128._M_dataplus._M_p = "Not Found";
  }
  else {
    if (iVar2 != 0x19f) goto LAB_001455a9;
    local_128._M_dataplus._M_p = "Unsupported Media Type";
  }
  local_48 = this;
  Stream::write_format<int,char_const*>(strm,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_128);
  local_e8 = strm;
  local_e0 = res;
  local_b0 = req;
  if (last_connection) {
    local_108._M_dataplus._M_p = "close";
  }
  else {
    paVar13 = &local_128.field_2;
    local_128._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Connection","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(req->headers)._M_t,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar13) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    p_Var10 = &(req->headers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar3._M_node == p_Var10) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)(cVar3._M_node + 2);
    }
    std::__cxx11::string::string((string *)&local_128,pcVar12,(allocator *)&local_108);
    iVar2 = std::__cxx11::string::compare((char *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar13) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      local_128._M_dataplus._M_p = "Connection";
      local_108._M_dataplus._M_p = "close";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_e0->headers,(char **)&local_128,(char **)&local_108);
    }
    local_128._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Connection","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(req->headers)._M_t,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar13) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar3._M_node == p_Var10) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)(cVar3._M_node + 2);
    }
    std::__cxx11::string::string((string *)&local_128,pcVar12,(allocator *)&local_108);
    iVar2 = std::__cxx11::string::compare((char *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar13) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    pRVar9 = local_e0;
    if (iVar2 != 0) goto LAB_0014578e;
    local_108._M_dataplus._M_p = "Keep-Alive";
  }
  pRVar9 = local_e0;
  local_128._M_dataplus._M_p = "Connection";
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const*&,char_const*&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e0->headers,(char **)&local_128,(char **)&local_108);
LAB_0014578e:
  pHVar14 = &pRVar9->headers;
  if ((pRVar9->body)._M_string_length == 0) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Content-Length","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar14->_M_t,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_e8;
    if ((_Rb_tree_header *)cVar3._M_node == &(pRVar9->headers)._M_t._M_impl.super__Rb_tree_header) {
      if ((pRVar9->streamcb).super__Function_base._M_manager == (_Manager_type)0x0) {
        local_128._M_dataplus._M_p = "Content-Length";
        local_108._M_dataplus._M_p = "0";
      }
      else {
        local_128._M_dataplus._M_p = "Transfer-Encoding";
        local_108._M_dataplus._M_p = "chunked";
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)pHVar14,(char **)&local_128,(char **)&local_108);
    }
  }
  else {
    paVar13 = &local_128.field_2;
    local_128._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Content-Type","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&pHVar14->_M_t,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar13) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar3._M_node == &(pRVar9->headers)._M_t._M_impl.super__Rb_tree_header) {
      local_128._M_dataplus._M_p = "Content-Type";
      local_108._M_dataplus._M_p = "text/plain";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)pHVar14,(char **)&local_128,(char **)&local_108);
    }
    __val = (pRVar9->body)._M_string_length;
    cVar11 = '\x01';
    if (9 < __val) {
      uVar6 = __val;
      cVar1 = '\x04';
      do {
        cVar11 = cVar1;
        if (uVar6 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_0014590b;
        }
        if (uVar6 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_0014590b;
        }
        if (uVar6 < 10000) goto LAB_0014590b;
        bVar16 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar1 = cVar11 + '\x04';
      } while (bVar16);
      cVar11 = cVar11 + '\x01';
    }
LAB_0014590b:
    local_128._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,__val);
    local_108._M_dataplus._M_p = "Content-Length";
    local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_128._M_dataplus._M_p;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)pHVar14,(char **)&local_108,(char **)&local_68);
    this_00 = local_e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar13) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      this_00 = local_e8;
    }
  }
  p_Var4 = (pRVar9->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(pRVar9->headers)._M_t._M_impl.super__Rb_tree_header;
  local_d8 = pHVar14;
  if ((_Rb_tree_header *)p_Var4 != p_Var10) {
    do {
      local_128._M_dataplus._M_p = *(pointer *)(p_Var4 + 1);
      local_108._M_dataplus._M_p = *(pointer *)(p_Var4 + 2);
      Stream::write_format<char_const*,char_const*>
                (this_00,"%s: %s\r\n",(char **)&local_128,(char **)&local_108);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var10);
  }
  (*this_00->_vptr_Stream[4])(this_00,"\r\n");
  iVar2 = std::__cxx11::string::compare((char *)&local_b0->method);
  pRVar9 = local_e0;
  if (iVar2 != 0) {
    if ((local_e0->body)._M_string_length == 0) {
      if ((local_e0->streamcb).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Content-Length","");
        local_38 = (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&local_d8->_M_t,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        local_40 = (_Any_data *)&pRVar9->streamcb;
        bVar16 = true;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        do {
          if (!bVar16) break;
          local_128._M_dataplus._M_p = (pointer)paVar13;
          if ((pRVar9->streamcb).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(pRVar9->streamcb)._M_invoker)(&local_108,local_40,(unsigned_long *)&local_128);
          bVar16 = (Headers *)local_108._M_string_length != (Headers *)0x0;
          local_d8 = (Headers *)local_108._M_string_length;
          if ((_Rb_tree_header *)local_38 == p_Var10) {
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_local_buf[0] = '\0';
            pHVar14 = (Headers *)local_108._M_string_length;
            do {
              std::operator+(&local_128,"0123456789abcdef"[(uint)pHVar14 & 0xf],&local_d0);
              std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_128);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              bVar15 = (Headers *)0xf < pHVar14;
              pHVar14 = (Headers *)((ulong)pHVar14 >> 4);
            } while (bVar15);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_a8 = &local_98;
            plVar7 = plVar5 + 2;
            if ((long *)*plVar5 == plVar7) {
              local_98 = *plVar7;
              lStack_90 = plVar5[3];
            }
            else {
              local_98 = *plVar7;
              local_a8 = (long *)*plVar5;
            }
            local_a0 = plVar5[1];
            *plVar5 = (long)plVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_a8,(ulong)local_108._M_dataplus._M_p);
            local_88 = &local_78;
            plVar7 = plVar5 + 2;
            if ((long *)*plVar5 == plVar7) {
              local_78 = *plVar7;
              lStack_70 = plVar5[3];
            }
            else {
              local_78 = *plVar7;
              local_88 = (long *)*plVar5;
            }
            local_80 = plVar5[1];
            *plVar5 = (long)plVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar8) {
              local_58._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_58._8_8_ = plVar5[3];
              local_68 = &local_58;
            }
            else {
              local_58._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar5;
            }
            local_60 = plVar5[1];
            *plVar5 = (long)paVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_68);
            if (local_68 != &local_58) {
              operator_delete(local_68,local_58._M_allocated_capacity + 1);
            }
            if (local_88 != &local_78) {
              operator_delete(local_88,local_78 + 1);
            }
            if (local_a8 != &local_98) {
              operator_delete(local_a8,local_98 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,
                              CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                       local_d0.field_2._M_local_buf[0]) + 1);
            }
          }
          iVar2 = (*local_e8->_vptr_Stream[3])
                            (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar13->_M_local_buf + (long)local_d8);
          pRVar9 = local_e0;
        } while (-1 < iVar2);
      }
    }
    else {
      (*local_e8->_vptr_Stream[3])(local_e8,(local_e0->body)._M_dataplus._M_p);
    }
  }
  if ((local_48->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_48->logger_)._M_invoker)((_Any_data *)&local_48->logger_,local_b0,pRVar9);
  }
  return;
}

Assistant:

inline void Server::write_response(Stream& strm, bool last_connection, const Request& req, Response& res)
{
    assert(res.status != -1);

    if (400 <= res.status && error_handler_) {
        error_handler_(req, res);
    }

    // Response line
    strm.write_format("HTTP/1.1 %d %s\r\n",
        res.status,
        detail::status_message(res.status));

    // Headers
    if (last_connection ||
        req.get_header_value("Connection") == "close") {
        res.set_header("Connection", "close");
    }

    if (!last_connection &&
        req.get_header_value("Connection") == "Keep-Alive") {
        res.set_header("Connection", "Keep-Alive");
    }

    if (res.body.empty()) {
        if (!res.has_header("Content-Length")) {
            if (res.streamcb) {
                // Streamed response
                res.set_header("Transfer-Encoding", "chunked");
            } else {
                res.set_header("Content-Length", "0");
            }
        }
    } else {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        // TODO: 'Accpet-Encoding' has gzip, not gzip;q=0
        const auto& encodings = req.get_header_value("Accept-Encoding");
        if (encodings.find("gzip") != std::string::npos &&
            detail::can_compress(res.get_header_value("Content-Type"))) {
            detail::compress(res.body);
            res.set_header("Content-Encoding", "gzip");
        }
#endif

        if (!res.has_header("Content-Type")) {
            res.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(res.body.size());
        res.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, res);

    // Body
    if (req.method != "HEAD") {
        if (!res.body.empty()) {
            strm.write(res.body.c_str(), res.body.size());
        } else if (res.streamcb) {
            bool chunked_response = !res.has_header("Content-Length");
            uint64_t offset = 0;
            bool data_available = true;
            while (data_available) {
                std::string chunk = res.streamcb(offset);
                offset += chunk.size();
                data_available = !chunk.empty();
                // Emit chunked response header and footer for each chunk
                if (chunked_response)
                    chunk = detail::from_i_to_hex(chunk.size()) + "\r\n" + chunk + "\r\n";
                if (strm.write(chunk.c_str(), chunk.size()) < 0)
                    break;  // Stop on error
            }
        }
    }

    // Log
    if (logger_) {
        logger_(req, res);
    }
}